

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

logical pnga_update5_ghosts(Integer g_a)

{
  short sVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  global_array_t *pgVar6;
  logical lVar7;
  logical lVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int i;
  int iVar13;
  int iVar14;
  long grp_id;
  double *pdVar15;
  bool bVar16;
  double dVar17;
  Integer width [7];
  
  iVar5 = _ga_sync_end;
  lVar10 = g_a + 1000;
  bVar16 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  iVar14 = GA[g_a + 1000].p_handle;
  grp_id = (long)iVar14;
  if (bVar16) {
    pnga_pgroup_sync(grp_id);
  }
  pdVar15 = GA[lVar10].cache;
  lVar7 = pnga_has_ghosts(g_a);
  pgVar6 = GA;
  lVar8 = 1;
  if (lVar7 != 0) {
    sVar1 = GA[lVar10].ndim;
    lVar11 = (long)sVar1;
    if (0 < lVar11) {
      memcpy(width,GA[g_a + 1000].width,lVar11 * 8);
    }
    lVar7 = gai_check_ghost_distr(g_a);
    if (lVar7 == 0) {
LAB_001897b2:
      lVar8 = 0;
    }
    else {
      iVar4 = 0;
      iVar2 = pgVar6[lVar10].corner_flag;
      *GA_Update_Signal = 1;
      if (0 < sVar1) {
        lVar10 = 0;
        iVar4 = 0;
        do {
          iVar12 = iVar4;
          if (width[lVar10] != 0) {
            if ((void *)*pdVar15 == (void *)0x0) goto LAB_001897b2;
            piVar9 = (int *)((long)pdVar15 + lVar11 * 4 + 0x10);
            piVar3 = piVar9 + lVar11;
            iVar12 = (int)*(undefined8 *)(piVar3 + lVar11);
            if (-1 < iVar14) {
              iVar12 = PGRP_LIST[grp_id].inv_map_proc_list[iVar12];
            }
            ARMCI_PutS_flag((void *)pdVar15[1],(int *)(pdVar15 + 2),(void *)*pdVar15,piVar9,piVar3,
                            sVar1 + -1,GA_Update_Flags[iVar12] + iVar4,*GA_Update_Signal,iVar12);
            piVar9 = piVar3 + lVar11 * 2 + 6 + lVar11;
            iVar12 = (int)*(undefined8 *)(piVar9 + lVar11);
            if (-1 < iVar14) {
              iVar12 = PGRP_LIST[grp_id].inv_map_proc_list[iVar12];
            }
            pdVar15 = (double *)(piVar9 + lVar11 + 2);
            ARMCI_PutS_flag(*(void **)(piVar3 + lVar11 + 4),piVar3 + lVar11 + 6,
                            *(void **)(piVar3 + lVar11 + 2),piVar3 + lVar11 * 2 + 6,piVar9,
                            sVar1 + -1,GA_Update_Flags[iVar12] + (iVar4 + 1),*GA_Update_Signal,
                            iVar12);
            iVar12 = iVar4 + 2;
            if (iVar2 != 0) {
              piVar3 = GA_Update_Flags[GAme];
              iVar13 = 1;
              while ((piVar3[(long)iVar12 + -2] == 0 || (piVar3[(long)iVar12 + -1] == 0))) {
                dVar17 = (double)iVar13;
                iVar13 = iVar13 + 1;
                exp(-dVar17);
              }
              piVar3 = GA_Update_Flags[GAme];
              piVar3[iVar4 + 1] = 0;
              piVar3[iVar4] = 0;
            }
          }
          iVar4 = iVar12;
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar11);
      }
      if (iVar4 != 0 && iVar2 == 0) {
        lVar10 = (long)iVar4;
        do {
          piVar3 = GA_Update_Flags[GAme];
          iVar14 = 1;
          while ((piVar3[lVar10 + -1] == 0 || (piVar3[lVar10 + -2] == 0))) {
            dVar17 = (double)iVar14;
            iVar14 = iVar14 + 1;
            exp(-dVar17);
          }
          piVar3 = GA_Update_Flags[GAme];
          piVar3[lVar10 + -1] = 0;
          piVar3[lVar10 + -2] = 0;
          lVar10 = lVar10 + -2;
        } while (lVar10 != 0);
      }
      if (iVar5 != 0) {
        pnga_pgroup_sync(grp_id);
      }
      lVar8 = 1;
    }
  }
  return lVar8;
}

Assistant:

logical pnga_update5_ghosts(Integer g_a)
{
  Integer idx, i, handle=GA_OFFSET + g_a;
  Integer /*size,*/ ndim, nwidth;
  Integer width[MAXDIM];
  Integer* proc_rem_ptr;
  int *stride_loc, *stride_rem,*count;
  int msgcnt, corner_flag, proc_rem;
  /* int bytes; */
  char *ptr_loc, *ptr_rem,*cache;
  int local_sync_begin,local_sync_end;
  Integer p_handle;
#ifdef USE_MP_NORTHSOUTH
  char send_name[32], rcv_name[32];
  void *snd_ptr, *rcv_ptr;
#endif
  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This operation is implemented using put calls to place the
   * appropriate data on remote processors. To signal the remote
   * processor that it has received the data, a second put call
   * consisting of a single integer is sent after the first put call and
   * used to update a signal buffer on the remote processor. Each
   * processor can determine how much data it has received by checking
   * its signal buffer. 
   */

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  p_handle = GA[handle].p_handle;
  if(local_sync_begin)pnga_pgroup_sync(p_handle);

#ifdef USE_MP_NORTHSOUTH
  strcpy(send_name,"send_buffer");
  strcpy(rcv_name,"receive_buffer");

  snd_ptr = pnga_malloc(buflen, GA[handle].type, send_name);
  rcv_ptr = pnga_malloc(buflen, GA[handle].type, rcv_name);
#endif
 
  cache = (char *)GA[handle].cache;
  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  /*size = GA[handle].elemsize;*/
  ndim = GA[handle].ndim;
  for (i=0; i<ndim; i++) {
    width[i] = (Integer)GA[handle].width[i];
  }

  if (!gai_check_ghost_distr(g_a)) return FALSE;


  /* loop over dimensions for sequential update using shift algorithm */
  msgcnt = 0;
  corner_flag = GA[handle].corner_flag;
  (*GA_Update_Signal) = 1;
  for (idx=0; idx < ndim; idx++) {
    nwidth = width[idx];
    if (nwidth != 0) {

      /* Perform update in negative direction. */
      ptr_rem = *(char **)(cache);
      if(ptr_rem==NULL) return FALSE;
      ptr_loc = *(char **)(cache+sizeof(char *));
      stride_loc = (int *)(cache+2*sizeof(char *));
      stride_rem = (int *)(stride_loc+ndim);
      count = (int *)(stride_rem+ndim);
      proc_rem_ptr = (Integer *)(count+ndim);
      proc_rem = (int)(*proc_rem_ptr);
      cache = (char *)(proc_rem_ptr+1);
          
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      if(count[0]>1000000){
        /*tries to use armci direct put when possible */
        ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
            (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
            *GA_Update_Signal, proc_rem);
      }
      else{
#ifndef USE_MP_NORTHSOUTH
        ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
            (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
            *GA_Update_Signal, proc_rem);
#else
#endif
      }

      msgcnt++;

      /* Perform update in positive direction. */
      ptr_rem = *(char **)(cache);
      ptr_loc = *(char **)(cache+sizeof(char *));
      stride_loc = (int *)(cache+2*sizeof(char *));
      stride_rem = (int *)(stride_loc+ndim);
      count = (int *)(stride_rem+ndim);
      proc_rem_ptr = (Integer *)(count+ndim);
      proc_rem = (int)(*proc_rem_ptr);
      cache = (char *)(proc_rem_ptr+1);

      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      if(count[0]>1000000){
        /*tries to use armci direct put when possible */
        ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
            (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
            *GA_Update_Signal, proc_rem);
      }
      else{
#ifndef USE_MP_NORTHSOUTH
        ARMCI_PutS_flag(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
            (int)(ndim - 1), GA_Update_Flags[proc_rem]+msgcnt,
            *GA_Update_Signal, proc_rem);
#else
#endif

      }

      msgcnt++;

      if (corner_flag){
        /* check to make sure that last two messages have been recieved
           before starting update along a new dimension */
        waitforflags((GA_Update_Flags[GAme]+msgcnt-2),
          (GA_Update_Flags[GAme]+msgcnt-1));
        GA_Update_Flags[GAme][msgcnt-1]=0;
        GA_Update_Flags[GAme][msgcnt-2]=0;
      }
    }
  }
#if 1
  if (!corner_flag) {
    /* check to make sure that all messages have been recieved */
    while(msgcnt){
      waitforflags((GA_Update_Flags[GAme]+msgcnt-1),
          (GA_Update_Flags[GAme]+msgcnt-2));
      GA_Update_Flags[GAme][msgcnt-1]=0;
      GA_Update_Flags[GAme][msgcnt-2]=0;
      msgcnt-=2;
    }
  }
#endif 
  if(local_sync_end)pnga_pgroup_sync(p_handle);
  return TRUE;
}